

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script)

{
  bool bVar1;
  CfdException *this_00;
  uint8_t leaf_version_local;
  allocator local_41;
  string local_40;
  
  leaf_version_local = leaf_version;
  TapBranch::TapBranch(&this->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006549e0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = leaf_version;
  Script::operator=(&(this->super_TapBranch).script_,script);
  bVar1 = TaprootUtil::IsValidLeafVersion(leaf_version);
  if (bVar1) {
    return;
  }
  local_40._M_dataplus._M_p = "cfdcore_taproot.cpp";
  local_40._M_string_length._0_4_ = 0x1cf;
  local_40.field_2._M_allocated_capacity = (long)"CfdInitializeTaprootScriptTree" + 0xd;
  logger::warn<unsigned_char&>
            ((CfdSourceLocation *)&local_40,"Unsupported leaf version. [{}]",&leaf_version_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"Unsupported leaf version.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script)
    : TapBranch() {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}